

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::to_resource_binding_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRVariable *var)

{
  StorageClass SVar1;
  bool bVar2;
  uint32_t binding;
  uint32_t space_set;
  SPIRType *pSVar3;
  char space;
  HLSLBindingFlagBits flag;
  Bitset flags;
  
  pSVar3 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  if ((pSVar3->storage != StorageClassPushConstant) &&
     (bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBinding),
     !bVar2)) {
switchD_0025c08f_default:
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&flags);
    return __return_storage_ptr__;
  }
  space = 't';
  flag = HLSL_BINDING_AUTO_SRV_BIT;
  switch(*(undefined4 *)&(pSVar3->super_IVariant).field_0xc) {
  case 0xf:
    SVar1 = pSVar3->storage;
    if (SVar1 == StorageClassStorageBuffer) {
      ParsedIR::get_buffer_block_flags(&flags,&(this->super_CompilerGLSL).super_Compiler.ir,var);
      if ((flags.lower._3_1_ & 1) == 0) goto LAB_0025c1fd;
      bVar2 = is_hlsl_force_storage_buffer_as_uav(this,(ID)(var->super_IVariant).self.id);
LAB_0025c1f9:
      if (bVar2 != false) goto LAB_0025c1fd;
      flag = HLSL_BINDING_AUTO_SRV_BIT;
      space = 't';
    }
    else {
      space = 'b';
      if (SVar1 == StorageClassPushConstant) {
        flag = HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT;
        break;
      }
      if (SVar1 != StorageClassUniform) goto switchD_0025c08f_default;
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar3->super_IVariant).self.id,DecorationBufferBlock
                        );
      if (!bVar2) {
        flag = HLSL_BINDING_AUTO_CBV_BIT;
        bVar2 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar3->super_IVariant).self.id,DecorationBlock);
        space = 'b';
        if (bVar2) break;
        goto switchD_0025c08f_default;
      }
      ParsedIR::get_buffer_block_flags(&flags,&(this->super_CompilerGLSL).super_Compiler.ir,var);
      if ((flags.lower._3_1_ & 1) != 0) {
        bVar2 = is_hlsl_force_storage_buffer_as_uav(this,(ID)(var->super_IVariant).self.id);
        goto LAB_0025c1f9;
      }
LAB_0025c1fd:
      flag = HLSL_BINDING_AUTO_UAV_BIT;
      space = 'u';
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&flags.higher._M_h);
    break;
  case 0x10:
    if ((((pSVar3->image).sampled == 2) && ((pSVar3->image).dim != DimSubpassData)) &&
       ((bVar2 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationNonWritable
                           ), !bVar2 || (this->field_0x2424 == '\0')))) {
      space = 'u';
      flag = HLSL_BINDING_AUTO_UAV_BIT;
    }
    break;
  case 0x11:
    break;
  case 0x12:
    space = 's';
    flag = HLSL_BINDING_AUTO_SAMPLER_BIT;
    break;
  default:
    goto switchD_0025c08f_default;
  }
  bVar2 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBinding);
  binding = 0;
  if (bVar2) {
    binding = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBinding);
  }
  bVar2 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationDescriptorSet);
  if (bVar2) {
    space_set = Compiler::get_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,
                           DecorationDescriptorSet);
  }
  else {
    space_set = -(uint)(flag == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT);
  }
  to_resource_register_abi_cxx11_(__return_storage_ptr__,this,flag,space,binding,space_set);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_resource_binding(const SPIRVariable &var)
{
	const auto &type = get<SPIRType>(var.basetype);

	// We can remap push constant blocks, even if they don't have any binding decoration.
	if (type.storage != StorageClassPushConstant && !has_decoration(var.self, DecorationBinding))
		return "";

	char space = '\0';

	HLSLBindingFlagBits resource_flags = HLSL_BINDING_AUTO_NONE_BIT;

	switch (type.basetype)
	{
	case SPIRType::SampledImage:
		space = 't'; // SRV
		resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
		break;

	case SPIRType::Image:
		if (type.image.sampled == 2 && type.image.dim != DimSubpassData)
		{
			if (has_decoration(var.self, DecorationNonWritable) && hlsl_options.nonwritable_uav_texture_as_srv)
			{
				space = 't'; // SRV
				resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
			}
			else
			{
				space = 'u'; // UAV
				resource_flags = HLSL_BINDING_AUTO_UAV_BIT;
			}
		}
		else
		{
			space = 't'; // SRV
			resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
		}
		break;

	case SPIRType::Sampler:
		space = 's';
		resource_flags = HLSL_BINDING_AUTO_SAMPLER_BIT;
		break;

	case SPIRType::Struct:
	{
		auto storage = type.storage;
		if (storage == StorageClassUniform)
		{
			if (has_decoration(type.self, DecorationBufferBlock))
			{
				Bitset flags = ir.get_buffer_block_flags(var);
				bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
				space = is_readonly ? 't' : 'u'; // UAV
				resource_flags = is_readonly ? HLSL_BINDING_AUTO_SRV_BIT : HLSL_BINDING_AUTO_UAV_BIT;
			}
			else if (has_decoration(type.self, DecorationBlock))
			{
				space = 'b'; // Constant buffers
				resource_flags = HLSL_BINDING_AUTO_CBV_BIT;
			}
		}
		else if (storage == StorageClassPushConstant)
		{
			space = 'b'; // Constant buffers
			resource_flags = HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT;
		}
		else if (storage == StorageClassStorageBuffer)
		{
			// UAV or SRV depending on readonly flag.
			Bitset flags = ir.get_buffer_block_flags(var);
			bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
			space = is_readonly ? 't' : 'u';
			resource_flags = is_readonly ? HLSL_BINDING_AUTO_SRV_BIT : HLSL_BINDING_AUTO_UAV_BIT;
		}

		break;
	}
	default:
		break;
	}

	if (!space)
		return "";

	uint32_t desc_set =
	    resource_flags == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT ? ResourceBindingPushConstantDescriptorSet : 0u;
	uint32_t binding = resource_flags == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT ? ResourceBindingPushConstantBinding : 0u;

	if (has_decoration(var.self, DecorationBinding))
		binding = get_decoration(var.self, DecorationBinding);
	if (has_decoration(var.self, DecorationDescriptorSet))
		desc_set = get_decoration(var.self, DecorationDescriptorSet);

	return to_resource_register(resource_flags, space, binding, desc_set);
}